

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O1

bool __thiscall
kmp_flag_64::wait_cancellable_nosleep
          (kmp_flag_64 *this,kmp_info_t *this_thr,int final_spin,void *itt_sync_obj)

{
  atomic<int> *paVar1;
  kmp_int32 kVar2;
  unsigned_long_long *puVar3;
  ompt_lw_taskteam_t *poVar4;
  bool bVar5;
  kmp_task_team_t *pkVar6;
  int iVar7;
  int iVar8;
  kmp_uint32 local_60;
  ompt_state_t local_4c;
  int local_48;
  int local_44;
  ompt_data_t *local_40;
  void *local_38;
  
  puVar3 = (this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc;
  local_38 = itt_sync_obj;
  if (final_spin == 0) {
    local_44 = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      local_60 = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar7 = 0;
      do {
        if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
             super_kmp_flag_native<unsigned_long_long>.loc ==
            (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) break;
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014a1f7:
          pkVar6 = (kmp_task_team_t *)0x0;
        }
        else {
          pkVar6 = (this_thr->th).th_task_team;
          if (pkVar6 == (kmp_task_team_t *)0x0) {
            (this_thr->th).th_reap_state = 1;
            goto LAB_0014a1f7;
          }
          if ((pkVar6->tt).tt_active == 0) {
            (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_0014a206:
            (this_thr->th).th_reap_state = 1;
          }
          else {
            if ((pkVar6->tt).tt_found_tasks != 1) goto LAB_0014a206;
            __kmp_execute_tasks_64(this_thr,kVar2,this,0,&local_44,local_38,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar7 < __kmp_itt_prepare_delay)) &&
           (iVar7 = iVar7 + 1, __kmp_itt_prepare_delay <= iVar7)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
        }
        if (__kmp_global.g.g_done == 0) {
          if (__kmp_use_yield - 1U < 2) {
            iVar8 = __kmp_avail_proc;
            if (__kmp_avail_proc == 0) {
              iVar8 = __kmp_xproc;
            }
            if (__kmp_nth <= iVar8) goto LAB_0014a29a;
            __kmp_yield();
          }
          else {
LAB_0014a29a:
            if ((__kmp_use_yield == 1) && (local_60 = local_60 - 2, local_60 == 0)) {
              __kmp_yield();
              local_60 = __kmp_yield_next;
            }
          }
          if (((this_thr->th).th_team == (kmp_team_p *)0x0) ||
             ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i != 1)) {
            iVar8 = 0;
            bVar5 = true;
          }
          else {
            iVar8 = 5;
            bVar5 = false;
          }
          if (((bVar5) &&
              ((iVar8 = 4, __kmp_dflt_blocktime != 0x7fffffff ||
               (__kmp_pause_status == kmp_soft_paused)))) &&
             ((pkVar6 == (kmp_task_team_t *)0x0 || ((pkVar6->tt).tt_found_tasks == 0)))) {
            __kmp_hardware_timestamp();
          }
        }
        else {
          iVar8 = 5;
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
        }
      } while (iVar8 != 5);
      if (((ompt_enabled._0_1_ & 1) != 0) && (*(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar7
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar7 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      goto joined_r0x0014a387;
    }
  }
  else {
    local_48 = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      this_thr->th_pad[0x548] = '\x01';
      if ((ompt_enabled._0_1_ & 1) != 0) {
        local_4c = *(ompt_state_t *)(this_thr->th_pad + 0x160);
        if ((local_4c == ompt_state_wait_barrier_implicit) &&
           (*(int *)(this_thr->th_pad + 0x20) != 0)) {
          local_40 = (ompt_data_t *)(this_thr->th_pad + 0x150);
        }
        else {
          poVar4 = (((this_thr->th).th_team)->t).ompt_serialized_team_info;
          if (poVar4 == (ompt_lw_taskteam_t *)0x0) {
            local_40 = &(((this_thr->th).th_current_task)->ompt_task_info).task_data;
          }
          else {
            local_40 = &(poVar4->ompt_task_info).task_data;
          }
        }
        if ((__kmp_tasking_mode == tskm_immediate_exec) ||
           ((this_thr->th).th_task_team == (kmp_task_team_t *)0x0)) {
          __ompt_implicit_task_end(this_thr,local_4c,local_40);
        }
      }
      local_60 = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar7 = 0;
      do {
        if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
             super_kmp_flag_native<unsigned_long_long>.loc ==
            (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) break;
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014a4b3:
          pkVar6 = (kmp_task_team_t *)0x0;
        }
        else {
          pkVar6 = (this_thr->th).th_task_team;
          if (pkVar6 == (kmp_task_team_t *)0x0) {
            (this_thr->th).th_reap_state = 1;
            goto LAB_0014a4b3;
          }
          if ((pkVar6->tt).tt_active == 0) {
            if ((ompt_enabled._0_1_ & 1) != 0) {
              __ompt_implicit_task_end(this_thr,local_4c,local_40);
            }
            (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_0014a4e0:
            (this_thr->th).th_reap_state = 1;
          }
          else {
            if ((pkVar6->tt).tt_found_tasks != 1) goto LAB_0014a4e0;
            __kmp_execute_tasks_64(this_thr,kVar2,this,1,&local_48,local_38,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar7 < __kmp_itt_prepare_delay)) &&
           (iVar7 = iVar7 + 1, __kmp_itt_prepare_delay <= iVar7)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
        }
        if (__kmp_global.g.g_done == 0) {
          if (__kmp_use_yield - 1U < 2) {
            iVar8 = __kmp_avail_proc;
            if (__kmp_avail_proc == 0) {
              iVar8 = __kmp_xproc;
            }
            if (__kmp_nth <= iVar8) goto LAB_0014a571;
            __kmp_yield();
          }
          else {
LAB_0014a571:
            if ((__kmp_use_yield == 1) && (local_60 = local_60 - 2, local_60 == 0)) {
              __kmp_yield();
              local_60 = __kmp_yield_next;
            }
          }
          if (((this_thr->th).th_team == (kmp_team_p *)0x0) ||
             ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i != 1)) {
            iVar8 = 0;
            bVar5 = true;
          }
          else {
            iVar8 = 5;
            bVar5 = false;
          }
          if (((bVar5) &&
              ((iVar8 = 4, __kmp_dflt_blocktime != 0x7fffffff ||
               (__kmp_pause_status == kmp_soft_paused)))) &&
             ((pkVar6 == (kmp_task_team_t *)0x0 || ((pkVar6->tt).tt_found_tasks == 0)))) {
            __kmp_hardware_timestamp();
          }
        }
        else {
          iVar8 = 5;
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
        }
      } while (iVar8 != 5);
      if (((*(ompt_state_t *)(this_thr->th_pad + 0x160) != ompt_state_undefined & ompt_enabled._0_1_
           ) == 1) &&
         (__ompt_implicit_task_end(this_thr,*(ompt_state_t *)(this_thr->th_pad + 0x160),local_40),
         *(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      this_thr->th_pad[0x548] = '\0';
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar7
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar7 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      local_44 = local_48;
joined_r0x0014a387:
      if (iVar7 != 1) {
        return false;
      }
      if (local_44 != 0) {
        LOCK();
        paVar1 = &(((this_thr->th).th_task_team)->tt).tt_unfinished_threads;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        return true;
      }
      return true;
    }
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
    (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
  }
  return false;
}

Assistant:

bool wait_cancellable_nosleep(kmp_info_t *this_thr,
                                int final_spin
                                    USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    bool retval = false;
    if (final_spin)
      retval = __kmp_wait_template<kmp_flag_64, TRUE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      retval = __kmp_wait_template<kmp_flag_64, FALSE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    return retval;
  }